

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O1

void __thiscall YAML::BadPushback::BadPushback(BadPushback *this)

{
  string local_50;
  Mark local_30;
  
  local_30.pos = -1;
  local_30.line = -1;
  local_30.column = -1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"appending to a non-sequence","");
  Exception::Exception((Exception *)this,&local_30,&local_50);
  *(undefined ***)&(this->super_RepresentationException).super_Exception = &PTR__BadFile_00889a10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  *(undefined ***)&(this->super_RepresentationException).super_Exception = &PTR__BadFile_00889b50;
  return;
}

Assistant:

BadPushback(const BadPushback&) = default;